

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkPointPoint.cpp
# Opt level: O1

ChVectorDynamic<> __thiscall
chrono::fea::ChLinkPointPoint::GetConstraintViolation(ChLinkPointPoint *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  long lVar7;
  long lVar8;
  void *pvVar9;
  undefined8 *puVar10;
  _func_int **pp_Var11;
  Index in_RDX;
  Index extraout_RDX;
  ActualDstType actualDst;
  long in_RSI;
  ChVectorDynamic<> CVar12;
  
  lVar7 = *(long *)(in_RSI + 600);
  lVar8 = *(long *)(in_RSI + 0x268);
  dVar1 = *(double *)(lVar7 + 0x20);
  dVar2 = *(double *)(lVar7 + 0x28);
  dVar3 = *(double *)(lVar8 + 0x20);
  dVar4 = *(double *)(lVar8 + 0x28);
  dVar5 = *(double *)(lVar7 + 0x30);
  dVar6 = *(double *)(lVar8 + 0x30);
  (this->super_ChLinkBase).super_ChPhysicsItem.super_ChObj._vptr_ChObj = (_func_int **)0x0;
  (this->super_ChLinkBase).super_ChPhysicsItem.super_ChObj.m_name._M_dataplus._M_p = (pointer)0x0;
  if ((this->super_ChLinkBase).super_ChPhysicsItem.super_ChObj.m_name._M_dataplus._M_p !=
      (pointer)0x3) {
    pp_Var11 = (this->super_ChLinkBase).super_ChPhysicsItem.super_ChObj._vptr_ChObj;
    if (pp_Var11 != (_func_int **)0x0) {
      free(pp_Var11[-1]);
    }
    pvVar9 = malloc(0x58);
    if (pvVar9 == (void *)0x0) {
      pp_Var11 = (_func_int **)0x0;
    }
    else {
      *(void **)(((ulong)pvVar9 & 0xffffffffffffffc0) + 0x38) = pvVar9;
      pp_Var11 = (_func_int **)(((ulong)pvVar9 & 0xffffffffffffffc0) + 0x40);
    }
    if (pp_Var11 == (_func_int **)0x0) {
      puVar10 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar10 = std::ostream::_M_insert<bool>;
      __cxa_throw(puVar10,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    (this->super_ChLinkBase).super_ChPhysicsItem.super_ChObj._vptr_ChObj = pp_Var11;
    in_RDX = extraout_RDX;
  }
  (this->super_ChLinkBase).super_ChPhysicsItem.super_ChObj.m_name._M_dataplus._M_p = (pointer)0x3;
  pp_Var11 = (this->super_ChLinkBase).super_ChPhysicsItem.super_ChObj._vptr_ChObj;
  *pp_Var11 = (_func_int *)(dVar1 - dVar3);
  pp_Var11[1] = (_func_int *)(dVar2 - dVar4);
  pp_Var11[2] = (_func_int *)(dVar5 - dVar6);
  CVar12.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = in_RDX;
  CVar12.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (ChVectorDynamic<>)
         CVar12.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

ChVectorDynamic<> ChLinkPointPoint::GetConstraintViolation() const {
    ChVector<> res = mnodeA->GetPos() - mnodeB->GetPos();
    ChVectorN<double, 3> C;
    C(0) = res.x();
    C(1) = res.y();
    C(2) = res.z();
    return C;
}